

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_strtok.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  constraint_handler_t p_Var2;
  char *local_58;
  char *ptr2;
  char *ptr1;
  rsize_t max2;
  rsize_t max1;
  char str2 [4];
  char str1 [12];
  char *p;
  rsize_t max;
  char cStack_10;
  char cStack_f;
  char s [10];
  
  s[2] = '\0';
  s[3] = '\0';
  s[4] = '\0';
  s[5] = '\0';
  stack0xffffffffffffffea = 0x645f5f63625f615f;
  s[0] = '_';
  s[1] = '\0';
  p = (char *)strlen((char *)((long)&max + 2));
  pcVar1 = _PDCLIB_strtok((char *)((long)&max + 2),(rsize_t *)&p,"_",(char **)(str1 + 4));
  if (pcVar1 != (char *)((long)&max + 3)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x84,"_PDCLIB_strtok( s, &max, \"_\", &p ) == &s[1]");
  }
  if (p != (char *)0x6) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x85,"max == 6");
  }
  if (max._3_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x86,"s[1] == \'a\'");
  }
  if (max._4_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x87,"s[2] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,(rsize_t *)&p,"_",(char **)(str1 + 4));
  if (pcVar1 != (char *)((long)&max + 5)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x88,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == &s[3]");
  }
  if (p != (char *)0x3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x89,"max == 3");
  }
  if (max._5_1_ != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8a,"s[3] == \'b\'");
  }
  if (max._6_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8b,"s[4] == \'c\'");
  }
  if (max._7_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8c,"s[5] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,(rsize_t *)&p,"_",(char **)(str1 + 4));
  if (pcVar1 != &cStack_f) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8d,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == &s[7]");
  }
  if (p != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8e,"max == 0");
  }
  if (cStack_10 != '_') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x8f,"s[6] == \'_\'");
  }
  if (cStack_f != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x90,"s[7] == \'d\'");
  }
  if (s[0] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x91,"s[8] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,(rsize_t *)&p,"_",(char **)(str1 + 4));
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x92,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == NULL");
  }
  if (p != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x93,"max == 0");
  }
  strcpy((char *)((long)&max + 2),"ab_cd");
  p = (char *)strlen((char *)((long)&max + 2));
  pcVar1 = _PDCLIB_strtok((char *)((long)&max + 2),(rsize_t *)&p,"_",(char **)(str1 + 4));
  if (pcVar1 != (char *)((long)&max + 2)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x96,"_PDCLIB_strtok( s, &max, \"_\", &p ) == &s[0]");
  }
  if (max._2_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x97,"s[0] == \'a\'");
  }
  if (max._3_1_ != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x98,"s[1] == \'b\'");
  }
  if (max._4_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x99,"s[2] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,(rsize_t *)&p,"_",(char **)(str1 + 4));
  if (pcVar1 != (char *)((long)&max + 5)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9a,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == &s[3]");
  }
  if (max._5_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9b,"s[3] == \'c\'");
  }
  if (max._6_1_ != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9c,"s[4] == \'d\'");
  }
  if (max._7_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9d,"s[5] == \'\\0\'");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,(rsize_t *)&p,"_",(char **)(str1 + 4));
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0x9e,"_PDCLIB_strtok( NULL, &max, \"_\", &p ) == NULL");
  }
  strcpy((char *)((long)&max + 2),"ab.cd");
  p = (char *)0x2;
  p_Var2 = set_constraint_handler_s(test_handler);
  if (p_Var2 != abort_handler_s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xa3,"set_constraint_handler_s( test_handler ) == abort_handler_s");
  }
  pcVar1 = _PDCLIB_strtok((char *)((long)&max + 2),(rsize_t *)&p,".",(char **)(str1 + 4));
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xa4,"_PDCLIB_strtok( s, &max, \".\", &p ) == NULL");
  }
  if (HANDLER_CALLS != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xa5,"HANDLER_CALLS == 1");
  }
  stack0xffffffffffffffcc = 0x2c2c623f3f3f613f;
  builtin_strncpy(str1,",#c",4);
  max1._0_4_ = 0x92009;
  max2 = strlen((char *)((long)&max1 + 4));
  ptr1 = (char *)strlen((char *)&max1);
  pcVar1 = _PDCLIB_strtok((char *)((long)&max1 + 4),&max2,"?",&ptr2);
  if (pcVar1 != (char *)((long)&max1 + 5)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb0,"_PDCLIB_strtok( str1, &max1, \"?\", &ptr1 ) == &str1[1]");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&max2,",",&ptr2);
  if (pcVar1 != (char *)((long)&max1 + 7)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb1,"_PDCLIB_strtok( NULL, &max1, \",\", &ptr1 ) == &str1[3]");
  }
  pcVar1 = _PDCLIB_strtok((char *)&max1,(rsize_t *)&ptr1," \t",&local_58);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb2,"_PDCLIB_strtok( str2, &max2, \" \\t\", &ptr2 ) == NULL");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&max2,"#,",&ptr2);
  if (pcVar1 != str1 + 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb3,"_PDCLIB_strtok( NULL, &max1, \"#,\", &ptr1 ) == &str1[10]");
  }
  pcVar1 = _PDCLIB_strtok((char *)0x0,&max2,"?",&ptr2);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_strtok.c, line %d - %s\n"
           ,0xb4,"_PDCLIB_strtok( NULL, &max1, \"?\", &ptr1 ) == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* The original PDCLib strtok() test */
    char s[] = "_a_bc__d_";
    rsize_t max = strlen( s );
    char * p;

    TESTCASE( _PDCLIB_strtok( s, &max, "_", &p ) == &s[1] );
    TESTCASE( max == 6 );
    TESTCASE( s[1] == 'a' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[3] );
    TESTCASE( max == 3 );
    TESTCASE( s[3] == 'b' );
    TESTCASE( s[4] == 'c' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[7] );
    TESTCASE( max == 0 );
    TESTCASE( s[6] == '_' );
    TESTCASE( s[7] == 'd' );
    TESTCASE( s[8] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == NULL );
    TESTCASE( max == 0 );
    strcpy( s, "ab_cd" );
    max = strlen( s );
    TESTCASE( _PDCLIB_strtok( s, &max, "_", &p ) == &s[0] );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[1] == 'b' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == &s[3] );
    TESTCASE( s[3] == 'c' );
    TESTCASE( s[4] == 'd' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( _PDCLIB_strtok( NULL, &max, "_", &p ) == NULL );

    /* Testing the constraint handling */
    strcpy( s, "ab.cd" );
    max = 2;
    TESTCASE( set_constraint_handler_s( test_handler ) == abort_handler_s );
    TESTCASE( _PDCLIB_strtok( s, &max, ".", &p ) == NULL );
    TESTCASE( HANDLER_CALLS == 1 );

    {
        /* The strtok_s() example code from the standard */
        char str1[] = "?a???b,,,#c";
        char str2[] = "\t \t";
        rsize_t max1 = strlen( str1 );
        rsize_t max2 = strlen( str2 );
        char * ptr1;
        char * ptr2;

        TESTCASE( _PDCLIB_strtok( str1, &max1, "?", &ptr1 ) == &str1[1] );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, ",", &ptr1 ) == &str1[3] );
        TESTCASE( _PDCLIB_strtok( str2, &max2, " \t", &ptr2 ) == NULL );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, "#,", &ptr1 ) == &str1[10] );
        TESTCASE( _PDCLIB_strtok( NULL, &max1, "?", &ptr1 ) == NULL );
    }
#endif
    return TEST_RESULTS;
}